

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void __thiscall FGLROptions::FGLROptions(FGLROptions *this)

{
  TVector3<float> local_34;
  TVector3<float> local_28 [2];
  FGLROptions *local_10;
  FGLROptions *this_local;
  
  local_10 = this;
  FOptionalMapinfoData::FOptionalMapinfoData(&this->super_FOptionalMapinfoData);
  (this->super_FOptionalMapinfoData)._vptr_FOptionalMapinfoData =
       (_func_int **)&PTR__FGLROptions_00b668f0;
  TVector3<float>::TVector3(&this->skyrotatevector);
  TVector3<float>::TVector3(&this->skyrotatevector2);
  FName::operator=(&(this->super_FOptionalMapinfoData).identifier,"gl_renderer");
  *(undefined4 *)&(this->super_FOptionalMapinfoData).field_0x14 = 0;
  this->outsidefogdensity = 0;
  this->skyfog = 0;
  this->brightfog = 0;
  this->lightmode = -1;
  this->nocoloredspritelighting = -1;
  this->notexturefill = -1;
  TVector3<float>::TVector3(local_28,0.0,0.0,1.0);
  TVector3<float>::operator=(&this->skyrotatevector,local_28);
  TVector3<float>::TVector3(&local_34,0.0,0.0,1.0);
  TVector3<float>::operator=(&this->skyrotatevector2,&local_34);
  this->pixelstretch = 1.2;
  return;
}

Assistant:

FGLROptions()
	{
		identifier = "gl_renderer";
		fogdensity = 0;
		outsidefogdensity = 0;
		skyfog = 0;
		brightfog = false;
		lightmode = -1;
		nocoloredspritelighting = -1;
		notexturefill = -1;
		skyrotatevector = FVector3(0,0,1);
		skyrotatevector2 = FVector3(0,0,1);
		pixelstretch = 1.2f;
	}